

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall
kratos::FunctionStmtBlock::create_function_handler
          (FunctionStmtBlock *this,uint32_t width,bool is_signed)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppIVar2;
  pointer ppIVar3;
  VarException *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  PortType local_74;
  element_type *local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int local_28;
  uint32_t width_local;
  bool is_signed_local;
  
  __str.field_2._12_4_ = width;
  width_local._3_1_ = is_signed;
  if ((this->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    local_70 = (element_type *)((ulong)local_70 & 0xffffffff00000000);
    pcVar1 = (this->function_name_)._M_dataplus._M_p;
    local_50 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + (this->function_name_)._M_string_length);
    std::__cxx11::string::append((char *)local_50);
    local_28 = 1;
    local_74 = Data;
    local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::Port,std::allocator<kratos::Port>,kratos::Generator*&,kratos::PortDirection,std::__cxx11::string,unsigned_int&,int,kratos::PortType,bool&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_68.
                super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,(Port **)&local_68,
               (allocator<kratos::Port> *)((long)&width_local + 2),&this->parent_,
               (PortDirection *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (uint *)(__str.field_2._M_local_buf + 0xc),&local_28,&local_74,
               (bool *)((long)&width_local + 3));
    std::__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::Port,kratos::Port>
              ((__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               (Port *)local_68.
                       super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    ppIVar3 = local_68.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppIVar2 = local_68.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = (this->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppIVar2;
    (this->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppIVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.
                 super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_50 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)local_50,__str._M_string_length + 1);
    }
    return;
  }
  this_01 = (VarException *)__cxa_allocate_exception(0x10);
  local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(this->function_name_)._M_dataplus._M_p;
  local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)(this->function_name_)._M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x22;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_50,(detail *)"{0} already has a function handler",format_str,args);
  local_70 = (this->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_70;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_68,__l,(allocator_type *)&local_28);
  VarException::VarException(this_01,(string *)local_50,&local_68);
  __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FunctionStmtBlock::create_function_handler(uint32_t width, bool is_signed) {
    if (function_handler_) {
        throw VarException(::format("{0} already has a function handler", function_name_),
                           {function_handler_.get()});
    }
    function_handler_ =
        std::make_shared<Port>(parent_, PortDirection::In, function_name_ + "_return", width, 1,
                               PortType::Data, is_signed);
}